

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

bool __thiscall rlist::listInsertNode(rlist *this,void *node,unsigned_long pos)

{
  listNode *plVar1;
  unsigned_long uVar2;
  listNode *plVar3;
  uint i;
  uint uVar4;
  
  uVar2 = listLength(this);
  if (pos < uVar2) {
    plVar3 = this->rl->head;
    this->view = plVar3;
    for (uVar4 = 1; plVar1 = plVar3->next, uVar4 != pos; uVar4 = uVar4 + 1) {
      this->view = plVar1;
      plVar3 = plVar1;
    }
    *(listNode **)((long)node + 8) = plVar1;
    *(listNode **)node = plVar3;
    plVar1->prev = (listNode *)node;
    plVar3->next = (listNode *)node;
  }
  else {
    if (uVar2 != pos) {
      return false;
    }
    listAppend(this,node);
  }
  return true;
}

Assistant:

bool rlist::listInsertNode(void *node,unsigned long pos){
    unsigned long tmp=rlist::listLength();
    if(tmp>pos){
        view=rl->head;
        for(unsigned int i=1;i!=pos;i++)
            view=view->next;
        ((listNode *)node)->next=view->next;
        ((listNode *)node)->prev=view;
        view->next->prev=(listNode *)node;
        view->next=(listNode *)node; 
        return true;
    }else if(tmp==pos)
        return rlist::listAppend(node);
    else 
        return false;
}